

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_3::copyFromDeepFrameBuffer
               (char **writePtr,char *base,char *sampleCountBase,ptrdiff_t sampleCountXStride,
               ptrdiff_t sampleCountYStride,int y,int xMin,int xMax,int xOffsetForSampleCount,
               int yOffsetForSampleCount,int xOffsetForData,int yOffsetForData,
               ptrdiff_t sampleStride,ptrdiff_t dataXStride,ptrdiff_t dataYStride,Format format,
               PixelType type)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  undefined8 uVar5;
  ArgExc *this;
  int in_ECX;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  size_t j_1;
  int in_stack_00000030;
  uint i_5;
  char *readPtr_5;
  char *ptr_5;
  long in_stack_00000048;
  uint count_5;
  int x_5;
  uint i_4;
  char *readPtr_4;
  char *ptr_4;
  uint count_4;
  int x_4;
  size_t j;
  uint i_3;
  char *readPtr_3;
  char *ptr_3;
  uint count_3;
  int x_3;
  uint i_2;
  char *readPtr_2;
  char *ptr_2;
  uint count_2;
  int x_2;
  uint i_1;
  char *readPtr_1;
  char *ptr_1;
  uint count_1;
  int x_1;
  uint i;
  char *readPtr;
  char *ptr;
  uint count;
  int x;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  ArgExc *in_stack_fffffffffffffed0;
  ulong local_110;
  uint local_104;
  char *local_100;
  int local_e8;
  uint local_e4;
  char *local_e0;
  int local_cc;
  ulong local_c8;
  uint local_bc;
  char *local_b8;
  int local_a0;
  uint local_8c;
  int local_74;
  uint local_6c;
  int local_50;
  uint local_4c;
  int local_30;
  
  if (x_5 == 1) {
    if ((int)readPtr_4 == 0) {
      for (local_30 = in_stack_00000008; local_30 <= in_stack_00000010; local_30 = local_30 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_30 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_4c = 0; local_4c < uVar2; local_4c = local_4c + 1) {
          Xdr::write<Imf_3_3::CharPtrIO,char*>
                    ((char **)in_stack_fffffffffffffed0,(uint)in_stack_fffffffffffffecc);
        }
      }
    }
    else if ((int)readPtr_4 == 1) {
      for (local_50 = in_stack_00000008; local_50 <= in_stack_00000010; local_50 = local_50 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_50 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 1) {
          Xdr::write<Imf_3_3::CharPtrIO,char*>
                    ((char **)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (half)(uint16_t)((ulong)in_stack_fffffffffffffed0 >> 0x30));
        }
      }
    }
    else {
      if ((int)readPtr_4 != 2) {
        uVar5 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  (in_stack_fffffffffffffed0,
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      for (local_74 = in_stack_00000008; local_74 <= in_stack_00000010; local_74 = local_74 + 1) {
        puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_74 - in_stack_00000018,
                                     in_R9D - in_stack_00000020);
        uVar2 = *puVar4;
        for (local_8c = 0; local_8c < uVar2; local_8c = local_8c + 1) {
          Xdr::write<Imf_3_3::CharPtrIO,char*>
                    ((char **)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        }
      }
    }
  }
  else if ((int)readPtr_4 == 0) {
    for (local_a0 = in_stack_00000008; local_a0 <= in_stack_00000010; local_a0 = local_a0 + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_a0 - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_b8 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                           (long)(local_a0 - (int)j_1) * (long)ptr_5);
      for (local_bc = 0; local_bc < uVar2; local_bc = local_bc + 1) {
        for (local_c8 = 0; local_c8 < 4; local_c8 = local_c8 + 1) {
          cVar1 = local_b8[local_c8];
          pcVar3 = (char *)*in_RDI;
          *in_RDI = (long)(pcVar3 + 1);
          *pcVar3 = cVar1;
        }
        local_b8 = readPtr_5 + (long)local_b8;
      }
    }
  }
  else if ((int)readPtr_4 == 1) {
    for (local_cc = in_stack_00000008; local_cc <= in_stack_00000010; local_cc = local_cc + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_cc - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_e0 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                           (long)(local_cc - (int)j_1) * (long)ptr_5);
      for (local_e4 = 0; local_e4 < uVar2; local_e4 = local_e4 + 1) {
        *(undefined2 *)*in_RDI = *(undefined2 *)local_e0;
        *in_RDI = *in_RDI + 2;
        local_e0 = readPtr_5 + (long)local_e0;
      }
    }
  }
  else {
    if ((int)readPtr_4 != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                (this,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    for (local_e8 = in_stack_00000008; local_e8 <= in_stack_00000010; local_e8 = local_e8 + 1) {
      puVar4 = (uint *)sampleCount(in_RDX,in_ECX,in_R8D,local_e8 - in_stack_00000018,
                                   in_R9D - in_stack_00000020);
      uVar2 = *puVar4;
      local_100 = *(char **)(in_RSI + (in_R9D - in_stack_00000030) * in_stack_00000048 +
                            (long)(local_e8 - (int)j_1) * (long)ptr_5);
      for (local_104 = 0; local_104 < uVar2; local_104 = local_104 + 1) {
        for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
          cVar1 = local_100[local_110];
          pcVar3 = (char *)*in_RDI;
          *in_RDI = (long)(pcVar3 + 1);
          *pcVar3 = cVar1;
        }
        local_100 = readPtr_5 + (long)local_100;
      }
    }
  }
  return;
}

Assistant:

void
copyFromDeepFrameBuffer (
    char*&             writePtr,
    const char*        base,
    char*              sampleCountBase,
    ptrdiff_t          sampleCountXStride,
    ptrdiff_t          sampleCountYStride,
    int                y,
    int                xMin,
    int                xMax,
    int                xOffsetForSampleCount,
    int                yOffsetForSampleCount,
    int                xOffsetForData,
    int                yOffsetForData,
    ptrdiff_t          sampleStride,
    ptrdiff_t          dataXStride,
    ptrdiff_t          dataYStride,
    Compressor::Format format,
    PixelType          type)
{
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The line or tile buffer is in XDR format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);
                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;
                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        Xdr::write<CharPtrIO> (
                            writePtr, *(const unsigned int*) readPtr);
                        readPtr += sampleStride;
                    }
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);
                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;
                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        Xdr::write<CharPtrIO> (
                            writePtr, *(const half*) readPtr);
                        readPtr += sampleStride;
                    }
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);
                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;

                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        Xdr::write<CharPtrIO> (
                            writePtr, *(const float*) readPtr);
                        readPtr += sampleStride;
                    }
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);

                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;
                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        for (size_t j = 0; j < sizeof (unsigned int); ++j)
                            *writePtr++ = readPtr[j];

                        readPtr += sampleStride;
                    }
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);
                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;
                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        *(half*) writePtr = *(const half*) readPtr;
                        writePtr += sizeof (half);
                        readPtr += sampleStride;
                    }
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                for (int x = xMin; x <= xMax; x++)
                {
                    unsigned int count = sampleCount (
                        sampleCountBase,
                        sampleCountXStride,
                        sampleCountYStride,
                        x - xOffsetForSampleCount,
                        y - yOffsetForSampleCount);

                    const char* ptr = base +
                                      (y - yOffsetForData) * dataYStride +
                                      (x - xOffsetForData) * dataXStride;
                    const char* readPtr = ((const char**) ptr)[0];
                    for (unsigned int i = 0; i < count; i++)
                    {
                        for (size_t j = 0; j < sizeof (float); ++j)
                            *writePtr++ = readPtr[j];

                        readPtr += sampleStride;
                    }
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}